

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__tga_test(stbi__context *s)

{
  byte bVar1;
  stbi_uc sVar2;
  uint uVar3;
  int iVar4;
  stbi__context *in_RDI;
  int sz;
  int res;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  bVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
  ;
  if (bVar1 < 2) {
    bVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffec,(uint)bVar1));
    uVar3 = (uint)bVar1;
    if (((((uVar3 == 1) || (uVar3 == 2)) || (uVar3 == 3)) || ((uVar3 == 9 || (uVar3 == 10)))) ||
       (uVar3 == 0xb)) {
      stbi__get16be(in_RDI);
      stbi__get16be(in_RDI);
      stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffec,uVar3));
      stbi__get16be(in_RDI);
      stbi__get16be(in_RDI);
      iVar4 = stbi__get16be(in_RDI);
      if (iVar4 < 1) {
        local_4 = 0;
      }
      else {
        iVar4 = stbi__get16be(in_RDI);
        if (iVar4 < 1) {
          local_4 = 0;
        }
        else {
          sVar2 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffec,uVar3));
          if (((sVar2 == '\b') || (sVar2 == '\x10')) || ((sVar2 == '\x18' || (sVar2 == ' ')))) {
            local_4 = 1;
          }
          else {
            local_4 = 0;
          }
          stbi__rewind(in_RDI);
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res;
   int sz;
   stbi__get8(s);      //   discard Offset
   sz = stbi__get8(s);   //   color type
   if ( sz > 1 ) return 0;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( (sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11) ) return 0;   //   only RGB or grey allowed, +/- RLE
   stbi__get16be(s);      //   discard palette start
   stbi__get16be(s);      //   discard palette length
   stbi__get8(s);         //   discard bits per palette color entry
   stbi__get16be(s);      //   discard x origin
   stbi__get16be(s);      //   discard y origin
   if ( stbi__get16be(s) < 1 ) return 0;      //   test width
   if ( stbi__get16be(s) < 1 ) return 0;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (sz != 8) && (sz != 16) && (sz != 24) && (sz != 32) )
      res = 0;
   else
      res = 1;
   stbi__rewind(s);
   return res;
}